

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void setup_planes(AV1_COMP *cpi,MACROBLOCK *x,uint *y_sad,uint *y_sad_g,uint *y_sad_alt,
                 uint *y_sad_last,MV_REFERENCE_FRAME *ref_frame_partition,scale_factors *sf_no_scale
                 ,int mi_row,int mi_col,_Bool is_small_sb,_Bool scaled_ref_last)

{
  BUFFER_SET *pBVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  undefined4 uVar6;
  int_interpfilters iVar7;
  int iVar8;
  MACROBLOCK *pMVar9;
  AV1_COMP *pAVar10;
  AV1_COMP *in_RCX;
  int *in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined4 *in_R8;
  int *in_R9;
  undefined8 in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  byte in_stack_00000028;
  byte in_stack_00000030;
  int est_motion;
  int source_sad_nonrd;
  int use_alt_ref;
  int use_golden_ref;
  int use_last_ref;
  YV12_BUFFER_CONFIG *yv12_alt;
  YV12_BUFFER_CONFIG *yv12_g;
  YV12_BUFFER_CONFIG *yv12;
  MB_MODE_INFO *mi;
  BLOCK_SIZE bsize;
  _Bool scaled_ref_alt;
  _Bool scaled_ref_golden;
  int num_planes;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined8 in_stack_fffffffffffffe88;
  MV_REFERENCE_FRAME ref_frame;
  AV1_COMMON *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  AV1_COMP *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb4;
  BLOCK_SIZE in_stack_fffffffffffffec7;
  BUFFER_SET *in_stack_fffffffffffffec8;
  MB_MODE_INFO *in_stack_fffffffffffffed0;
  MACROBLOCK *in_stack_fffffffffffffed8;
  AV1_COMP *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  AV1_COMP *in_stack_fffffffffffffef0;
  MACROBLOCK *in_stack_fffffffffffffef8;
  AV1_COMP *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff10;
  MACROBLOCK *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar11;
  undefined1 is_small_sb_00;
  int in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff35;
  bool bVar12;
  undefined1 uVar13;
  bool bVar14;
  undefined1 uVar15;
  AV1_COMP *x_00;
  AV1_COMP *cpi_00;
  int local_a8;
  undefined8 local_90;
  AV1_COMP *local_88;
  
  is_small_sb_00 = (undefined1)((uint)in_stack_ffffffffffffff2c >> 0x18);
  ref_frame = (MV_REFERENCE_FRAME)((ulong)in_stack_fffffffffffffe88 >> 0x38);
  iVar8 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  bVar4 = in_stack_00000030 & 1;
  pMVar9 = (MACROBLOCK *)(in_RSI + 0x1a0);
  cpi_00 = in_RCX;
  av1_num_planes((AV1_COMMON *)(in_RDI + 0x77f0));
  bVar2 = false;
  bVar3 = false;
  bVar5 = 0xf;
  if ((in_stack_00000028 & 1) != 0) {
    bVar5 = 0xc;
  }
  pBVar1 = (BUFFER_SET *)**(long **)(in_RSI + 0x2058);
  if (bVar4 == 0) {
    pAVar10 = (AV1_COMP *)
              get_ref_frame_yv12_buf
                        ((AV1_COMMON *)in_stack_fffffffffffffea0,
                         (MV_REFERENCE_FRAME)((uint)iVar8 >> 0x18));
  }
  else {
    pAVar10 = (AV1_COMP *)av1_get_scaled_ref_frame(in_stack_fffffffffffffea0,iVar8);
  }
  local_90 = (AV1_COMP *)0x0;
  bVar14 = true;
  if ((*(uint *)(in_RDI + 0xc117) & 1) == 0) {
    bVar14 = 1 < (int)in_RDI[0x13a67];
  }
  bVar12 = true;
  if (((*(int *)(*in_RDI + 0x14dc0) == 0) && (bVar12 = true, *(int *)((long)in_RDI + 0x60cb4) == 0))
     && (in_stack_ffffffffffffff35 = false, bVar12 = (bool)in_stack_ffffffffffffff35,
        (int)in_RDI[0xc197] != 0)) {
    in_stack_ffffffffffffff35 = *(int *)((long)in_RDI + 0x60cc4) == 1;
    bVar12 = (bool)in_stack_ffffffffffffff35;
  }
  uVar13 = bVar12;
  uVar15 = bVar14;
  x_00 = pAVar10;
  if ((((int)in_RDI[0x13a67] == 1) && ((*(uint *)(in_RDI + 0xc117) & 8) != 0)) &&
     ((*(int *)(in_RSI + 0x15d60) != 0 || (bVar14 == false)))) {
    local_88 = (AV1_COMP *)
               get_ref_frame_yv12_buf
                         ((AV1_COMMON *)in_stack_fffffffffffffea0,
                          (MV_REFERENCE_FRAME)((uint)iVar8 >> 0x18));
    if ((local_88 != (AV1_COMP *)0x0) &&
       (((((anon_union_8_2_abde48f3_for_yv12_buffer_config_6 *)
          ((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)&local_88->enc_quant_dequant_params +
          1))->field_0).y_crop_height != *(int *)((long)in_RDI + 0x3bfbc) ||
        ((((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)&local_88->enc_quant_dequant_params)
         ->field_0).y_crop_width != (int)in_RDI[0x77f7])))) {
      local_88 = (AV1_COMP *)av1_get_scaled_ref_frame(in_stack_fffffffffffffea0,iVar8);
      bVar2 = true;
    }
    if ((local_88 != (AV1_COMP *)0x0) && (local_88 != pAVar10)) {
      in_stack_ffffffffffffff18 = pMVar9;
      iVar11 = in_stack_00000018;
      in_stack_ffffffffffffff30 = in_stack_00000020;
      if (bVar2) {
        in_stack_ffffffffffffff10 = (YV12_BUFFER_CONFIG *)0x0;
      }
      else {
        in_stack_ffffffffffffff10 =
             (YV12_BUFFER_CONFIG *)get_ref_scale_factors(in_stack_fffffffffffffe90,ref_frame);
      }
      in_stack_ffffffffffffff20 = (int)local_88;
      is_small_sb_00 = (undefined1)((uint)iVar11 >> 0x18);
      av1_setup_pre_planes
                ((MACROBLOCKD *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                 (YV12_BUFFER_CONFIG *)in_stack_fffffffffffffee0,
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                 (scale_factors *)in_stack_fffffffffffffed0,(int)in_stack_ffffffffffffff10);
      uVar6 = (**(code **)(*in_RDI + 0xc900 + (ulong)bVar5 * 0x70))
                        (*(undefined8 *)(in_RSI + 0x30),*(undefined4 *)(in_RSI + 0x48),
                         *(undefined8 *)(in_RSI + 0x1e0),*(undefined4 *)(in_RSI + 0x1f8));
      *(undefined4 *)&in_RCX->ppi = uVar6;
    }
  }
  if (((((int)in_RDI[0x13a67] == 1) && (bVar12 != false)) &&
      ((*(uint *)(in_RDI + 0xc117) & 0x40) != 0)) &&
     ((*(int *)(in_RSI + 0x15d60) != 0 || (bVar14 == false)))) {
    local_90 = (AV1_COMP *)
               get_ref_frame_yv12_buf
                         ((AV1_COMMON *)in_stack_fffffffffffffea0,
                          (MV_REFERENCE_FRAME)((uint)iVar8 >> 0x18));
    if ((local_90 != (AV1_COMP *)0x0) &&
       (((((anon_union_8_2_abde48f3_for_yv12_buffer_config_6 *)
          ((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)&local_90->enc_quant_dequant_params +
          1))->field_0).y_crop_height != *(int *)((long)in_RDI + 0x3bfbc) ||
        ((((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)&local_90->enc_quant_dequant_params)
         ->field_0).y_crop_width != (int)in_RDI[0x77f7])))) {
      local_90 = (AV1_COMP *)av1_get_scaled_ref_frame(in_stack_fffffffffffffea0,iVar8);
      bVar3 = true;
    }
    if ((local_90 != (AV1_COMP *)0x0) && (local_90 != pAVar10)) {
      in_stack_fffffffffffffef8 = pMVar9;
      in_stack_ffffffffffffff00 = local_90;
      in_stack_ffffffffffffff08 = in_stack_00000018;
      in_stack_ffffffffffffff0c = in_stack_00000020;
      if (bVar3) {
        in_stack_fffffffffffffef0 = (AV1_COMP *)0x0;
      }
      else {
        in_stack_fffffffffffffef0 =
             (AV1_COMP *)get_ref_scale_factors(in_stack_fffffffffffffe90,ref_frame);
      }
      av1_setup_pre_planes
                ((MACROBLOCKD *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                 (YV12_BUFFER_CONFIG *)in_stack_fffffffffffffee0,
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                 (scale_factors *)in_stack_fffffffffffffed0,(int)in_stack_ffffffffffffff10);
      uVar6 = (**(code **)(*in_RDI + 0xc900 + (ulong)bVar5 * 0x70))
                        (*(undefined8 *)(in_RSI + 0x30),*(undefined4 *)(in_RSI + 0x48),
                         *(undefined8 *)(in_RSI + 0x1e0),*(undefined4 *)(in_RSI + 0x1f8));
      *in_R8 = uVar6;
    }
  }
  if (bVar14 != false) {
    iVar8 = *(int *)(in_RSI + 0x15d60);
    in_stack_fffffffffffffee8 = in_stack_00000018;
    in_stack_fffffffffffffeec = in_stack_00000020;
    if (bVar4 == 0) {
      in_stack_fffffffffffffed0 =
           (MB_MODE_INFO *)get_ref_scale_factors(in_stack_fffffffffffffe90,ref_frame);
      in_stack_fffffffffffffed8 = pMVar9;
      in_stack_fffffffffffffee0 = pAVar10;
    }
    else {
      in_stack_fffffffffffffed0 = (MB_MODE_INFO *)0x0;
      in_stack_fffffffffffffed8 = pMVar9;
      in_stack_fffffffffffffee0 = pAVar10;
    }
    av1_setup_pre_planes
              ((MACROBLOCKD *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               (YV12_BUFFER_CONFIG *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
               (scale_factors *)in_stack_fffffffffffffed0,(int)in_stack_ffffffffffffff10);
    *(undefined1 *)(pBVar1->plane + 2) = 1;
    *(undefined1 *)((long)pBVar1->plane + 0x11) = 0xff;
    *(undefined1 *)pBVar1->plane = *(undefined1 *)(in_RDI[0x8401] + 0x1c);
    *(uint *)(pBVar1->plane + 1) = 0;
    in_stack_fffffffffffffec8 = pBVar1;
    iVar7 = av1_broadcast_interp_filter(BILINEAR);
    *(int_interpfilters *)((long)in_stack_fffffffffffffec8->plane + 0x14) = iVar7;
    local_a8 = *(int *)((long)in_RDI + 0x60c9c);
    if ((2 < local_a8) && (3 < iVar8)) {
      local_a8 = 2;
    }
    if ((((local_a8 == 1) || (local_a8 == 2)) && (-1 < *(int *)(in_RSI + 0x2098))) &&
       (((-1 < *(int *)(in_RSI + 0x20a0) && (100 < *(uint *)(in_RSI + 0x25640))) && (2 < iVar8)))) {
      do_int_pro_motion_estimation
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (uint *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                 in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    }
    if (*in_RDX == -1) {
      iVar8 = (**(code **)(*in_RDI + 0xc900 + (ulong)bVar5 * 0x70))
                        (*(undefined8 *)(in_RSI + 0x30),*(undefined4 *)(in_RSI + 0x48),
                         *(undefined8 *)(in_RSI + 0x1e0),*(undefined4 *)(in_RSI + 0x1f8));
      *in_RDX = iVar8;
    }
    if ((1 < local_a8) &&
       (((*(byte *)(in_RSI + 0x2060) & 1) != 0 || ((*(byte *)(in_RSI + 0x2061) & 1) != 0)))) {
      evaluate_neighbour_mvs
                (cpi_00,(MACROBLOCK *)x_00,
                 (uint *)CONCAT17(uVar15,CONCAT16(uVar13,CONCAT15(in_stack_ffffffffffffff35,
                                                                  CONCAT14(in_stack_ffffffffffffff34
                                                                           ,
                                                  in_stack_ffffffffffffff30)))),
                 (_Bool)is_small_sb_00,in_stack_ffffffffffffff28);
    }
    *in_R9 = *in_RDX;
  }
  iVar11 = (int)in_stack_fffffffffffffef8;
  set_ref_frame_for_partition
            (in_stack_fffffffffffffef0,
             (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (MACROBLOCKD *)in_stack_fffffffffffffee0,
             (MV_REFERENCE_FRAME *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (uint *)in_stack_fffffffffffffec8,(uint *)in_stack_ffffffffffffff00,
             (uint *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff10,(YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
  iVar8 = (int)in_stack_fffffffffffffef0;
  if (*(uint *)(pBVar1->plane + 1) != 0) {
    if (bVar4 == 0) {
      set_ref_ptrs((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_00000020),
                   (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeac,in_stack_00000018),
                   (MV_REFERENCE_FRAME)((ushort)local_90._6_2_ >> 8),
                   (MV_REFERENCE_FRAME)local_90._6_2_);
    }
    else {
      *(undefined8 *)(in_RSI + 0x20a8) = in_stack_00000010;
      *(undefined8 *)(in_RSI + 0x20b0) = in_stack_00000010;
    }
    av1_enc_build_inter_predictor
              ((AV1_COMMON *)in_stack_fffffffffffffee0,(MACROBLOCKD *)in_stack_fffffffffffffed8,
               (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec7,iVar8,iVar11);
  }
  return;
}

Assistant:

static void setup_planes(AV1_COMP *cpi, MACROBLOCK *x, unsigned int *y_sad,
                         unsigned int *y_sad_g, unsigned int *y_sad_alt,
                         unsigned int *y_sad_last,
                         MV_REFERENCE_FRAME *ref_frame_partition,
                         struct scale_factors *sf_no_scale, int mi_row,
                         int mi_col, bool is_small_sb, bool scaled_ref_last) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const int num_planes = av1_num_planes(cm);
  bool scaled_ref_golden = false;
  bool scaled_ref_alt = false;
  BLOCK_SIZE bsize = is_small_sb ? BLOCK_64X64 : BLOCK_128X128;
  MB_MODE_INFO *mi = xd->mi[0];
  const YV12_BUFFER_CONFIG *yv12 =
      scaled_ref_last ? av1_get_scaled_ref_frame(cpi, LAST_FRAME)
                      : get_ref_frame_yv12_buf(cm, LAST_FRAME);
  assert(yv12 != NULL);
  const YV12_BUFFER_CONFIG *yv12_g = NULL;
  const YV12_BUFFER_CONFIG *yv12_alt = NULL;
  // Check if LAST is a reference. For spatial layers always use it as
  // reference scaling.
  int use_last_ref = (cpi->ref_frame_flags & AOM_LAST_FLAG) ||
                     cpi->svc.number_spatial_layers > 1;
  int use_golden_ref = cpi->ref_frame_flags & AOM_GOLD_FLAG;
  int use_alt_ref = cpi->ppi->rtc_ref.set_ref_frame_config ||
                    cpi->sf.rt_sf.use_nonrd_altref_frame ||
                    (cpi->sf.rt_sf.use_comp_ref_nonrd &&
                     cpi->sf.rt_sf.ref_frame_comp_nonrd[2] == 1);

  // For 1 spatial layer: GOLDEN is another temporal reference.
  // Check if it should be used as reference for partitioning.
  if (cpi->svc.number_spatial_layers == 1 && use_golden_ref &&
      (x->content_state_sb.source_sad_nonrd != kZeroSad || !use_last_ref)) {
    yv12_g = get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
    if (yv12_g && (yv12_g->y_crop_height != cm->height ||
                   yv12_g->y_crop_width != cm->width)) {
      yv12_g = av1_get_scaled_ref_frame(cpi, GOLDEN_FRAME);
      scaled_ref_golden = true;
    }
    if (yv12_g && yv12_g != yv12) {
      av1_setup_pre_planes(
          xd, 0, yv12_g, mi_row, mi_col,
          scaled_ref_golden ? NULL : get_ref_scale_factors(cm, GOLDEN_FRAME),
          num_planes);
      *y_sad_g = cpi->ppi->fn_ptr[bsize].sdf(
          x->plane[AOM_PLANE_Y].src.buf, x->plane[AOM_PLANE_Y].src.stride,
          xd->plane[AOM_PLANE_Y].pre[0].buf,
          xd->plane[AOM_PLANE_Y].pre[0].stride);
    }
  }

  // For 1 spatial layer: ALTREF is another temporal reference.
  // Check if it should be used as reference for partitioning.
  if (cpi->svc.number_spatial_layers == 1 && use_alt_ref &&
      (cpi->ref_frame_flags & AOM_ALT_FLAG) &&
      (x->content_state_sb.source_sad_nonrd != kZeroSad || !use_last_ref)) {
    yv12_alt = get_ref_frame_yv12_buf(cm, ALTREF_FRAME);
    if (yv12_alt && (yv12_alt->y_crop_height != cm->height ||
                     yv12_alt->y_crop_width != cm->width)) {
      yv12_alt = av1_get_scaled_ref_frame(cpi, ALTREF_FRAME);
      scaled_ref_alt = true;
    }
    if (yv12_alt && yv12_alt != yv12) {
      av1_setup_pre_planes(
          xd, 0, yv12_alt, mi_row, mi_col,
          scaled_ref_alt ? NULL : get_ref_scale_factors(cm, ALTREF_FRAME),
          num_planes);
      *y_sad_alt = cpi->ppi->fn_ptr[bsize].sdf(
          x->plane[AOM_PLANE_Y].src.buf, x->plane[AOM_PLANE_Y].src.stride,
          xd->plane[AOM_PLANE_Y].pre[0].buf,
          xd->plane[AOM_PLANE_Y].pre[0].stride);
    }
  }

  if (use_last_ref) {
    const int source_sad_nonrd = x->content_state_sb.source_sad_nonrd;
    av1_setup_pre_planes(
        xd, 0, yv12, mi_row, mi_col,
        scaled_ref_last ? NULL : get_ref_scale_factors(cm, LAST_FRAME),
        num_planes);
    mi->ref_frame[0] = LAST_FRAME;
    mi->ref_frame[1] = NONE_FRAME;
    mi->bsize = cm->seq_params->sb_size;
    mi->mv[0].as_int = 0;
    mi->interp_filters = av1_broadcast_interp_filter(BILINEAR);

    int est_motion = cpi->sf.rt_sf.estimate_motion_for_var_based_partition;
    // TODO(b/290596301): Look into adjusting this condition.
    // There is regression on color content when
    // estimate_motion_for_var_based_partition = 3 and high motion,
    // so for now force it to 2 based on superblock sad.
    if (est_motion > 2 && source_sad_nonrd > kMedSad) est_motion = 2;

    if ((est_motion == 1 || est_motion == 2) && xd->mb_to_right_edge >= 0 &&
        xd->mb_to_bottom_edge >= 0 && x->source_variance > 100 &&
        source_sad_nonrd > kLowSad) {
      do_int_pro_motion_estimation(cpi, x, y_sad, mi_row, mi_col,
                                   source_sad_nonrd);
    }

    if (*y_sad == UINT_MAX) {
      *y_sad = cpi->ppi->fn_ptr[bsize].sdf(
          x->plane[AOM_PLANE_Y].src.buf, x->plane[AOM_PLANE_Y].src.stride,
          xd->plane[AOM_PLANE_Y].pre[0].buf,
          xd->plane[AOM_PLANE_Y].pre[0].stride);
    }

    // Evaluate if neighbours' MVs give better predictions. Zero MV is tested
    // already, so only non-zero MVs are tested here. Here the neighbour blocks
    // are the first block above or left to this superblock.
    if (est_motion >= 2 && (xd->up_available || xd->left_available))
      evaluate_neighbour_mvs(cpi, x, y_sad, is_small_sb, est_motion);

    *y_sad_last = *y_sad;
  }

  // Pick the ref frame for partitioning, use golden or altref frame only if
  // its lower sad, bias to LAST with factor 0.9.
  set_ref_frame_for_partition(cpi, x, xd, ref_frame_partition, mi, y_sad,
                              y_sad_g, y_sad_alt, yv12_g, yv12_alt, mi_row,
                              mi_col, num_planes);

  // Only calculate the predictor for non-zero MV.
  if (mi->mv[0].as_int != 0) {
    if (!scaled_ref_last) {
      set_ref_ptrs(cm, xd, mi->ref_frame[0], mi->ref_frame[1]);
    } else {
      xd->block_ref_scale_factors[0] = sf_no_scale;
      xd->block_ref_scale_factors[1] = sf_no_scale;
    }
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL,
                                  cm->seq_params->sb_size, AOM_PLANE_Y,
                                  num_planes - 1);
  }
}